

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O1

int __thiscall mkvparser::Track::Info::CopyStr(Info *this,offset_in_Info_to_unknown str,Info *dst_)

{
  char *__s;
  size_t sVar1;
  char *__dest;
  int iVar2;
  
  iVar2 = -1;
  if ((str != 0xffffffffffffffff) && (*(long *)((long)&dst_->type + str) == 0)) {
    __s = *(char **)((long)&this->type + str);
    if (__s != (char *)0x0) {
      sVar1 = strlen(__s);
      if (sVar1 < 0x80000000) {
        __dest = (char *)operator_new__(sVar1 + 1,(nothrow_t *)&std::nothrow);
      }
      else {
        __dest = (char *)0x0;
      }
      *(char **)((long)&dst_->type + str) = __dest;
      if (__dest == (char *)0x0) {
        return -1;
      }
      strcpy(__dest,__s);
    }
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int Track::Info::CopyStr(char* Info::*str, Info& dst_) const {
  if (str == static_cast<char * Info::*>(NULL))
    return -1;

  char*& dst = dst_.*str;

  if (dst)  // should be NULL already
    return -1;

  const char* const src = this->*str;

  if (src == NULL)
    return 0;

  const size_t len = strlen(src);

  dst = SafeArrayAlloc<char>(1, len + 1);

  if (dst == NULL)
    return -1;

  strcpy(dst, src);

  return 0;
}